

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_compaction_test.cc
# Opt level: O1

void * compactor_thread(void *voidargs)

{
  openfiles_elem_conflict *elem;
  long lVar1;
  atomic<unsigned_char> aVar2;
  bool bVar3;
  fdb_status fVar4;
  avl_node *node;
  size_t sVar5;
  ulong uVar6;
  avl_node *paVar7;
  int iVar8;
  pthread_mutex_t *__mutex;
  fdb_file_handle *fhandle;
  list cmp_func_list;
  char vfilename [1024];
  openfiles_elem_conflict query;
  char new_filename [1024];
  fdb_file_handle *local_d90;
  list local_d88;
  char local_d78 [1024];
  timespec local_978 [81];
  avl_node local_468 [2];
  char local_438 [1032];
  
  pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
  __mutex = &sync_mutex;
  if (compactor_terminate_signal.super___atomic_base<unsigned_char>._M_i == '\0') {
    local_978[0] = convert_reltime_to_abstime((int)sleep_duration * 1000);
    pthread_cond_timedwait
              ((pthread_cond_t *)&sync_cond,(pthread_mutex_t *)&sync_mutex,(timespec *)local_978);
    pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
    do {
      pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
      node = avl_first(&openfiles);
      while (node != (avl_node *)0x0) {
        elem = (openfiles_elem_conflict *)(node + -0x36);
        if (node[-0xc].right == (avl_node *)0x0) {
          paVar7 = avl_next(node);
          avl_remove(&openfiles,node);
          free(elem);
          node = paVar7;
        }
        else {
          bVar3 = _compactor_is_threshold_satisfied(elem);
          if (bVar3) {
            *(undefined2 *)((long)&node[-1].left + 4) = 0x101;
            pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
            sVar5 = strlen((char *)elem);
            uVar6 = sVar5 & 0xffffffff;
            iVar8 = (int)sVar5 + 1;
            do {
              if ((int)uVar6 < 1) {
                iVar8 = 0;
                break;
              }
              iVar8 = iVar8 + -1;
              lVar1 = uVar6 - 0x511;
              uVar6 = uVar6 - 1;
            } while (*(char *)((long)node + lVar1) != '.');
            if (0 < iVar8) {
              strncpy(local_d78,(char *)elem,(ulong)(iVar8 - 1));
              local_d78[iVar8 - 1] = '\0';
            }
            local_d88 = (list)ZEXT816(0);
            fdb_cmp_func_list_from_filemgr((filemgr *)node[-0xc].right,&local_d88);
            fVar4 = fdb_open_for_compactor
                              (&local_d90,local_d78,(fdb_config *)(node + -0xb),&local_d88);
            fdb_free_cmp_func_list(&local_d88);
            if (fVar4 == FDB_RESULT_SUCCESS) {
              compactor_get_next_filename((char *)elem,local_438);
              fdb_compact_file(local_d90,local_438,false,0xffffffffffffffff,false,
                               (fdb_encryption_key *)0x0,(fdb_compact_opt *)0x0);
              fdb_close(local_d90);
              strcpy((char *)local_978,local_438);
              pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
              paVar7 = avl_search_greater(&openfiles,local_468,_compactor_cmp);
            }
            else {
              fprintf(_stderr,
                      "Error status code: %d, Failed to open the file \'%s\' for auto daemon compaction.\n"
                      ,(ulong)(uint)fVar4,local_d78);
              pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
              paVar7 = avl_next(node);
              *(undefined2 *)((long)&node[-1].left + 4) = 0;
            }
          }
          else if ((((ulong)(node[-0xc].right)->left & 0x1000000000) == 0) ||
                  (*(char *)((long)&node[-1].left + 6) == '\x01')) {
            paVar7 = avl_next(node);
          }
          else {
            *(undefined1 *)((long)&node[-1].left + 6) = 1;
            pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
            iVar8 = (*(code *)node[-0xc].right[9].right[1].parent)
                              (*(undefined4 *)((long)&(node[-0xc].right)->right + 4));
            filemgr_remove_all_buffer_blocks((filemgr *)node[-0xc].right);
            pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
            if ((iVar8 != 0) && (node[-1].right != (avl_node *)0x0)) {
              compactor_thread();
            }
            filemgr_free_func((hash_elem *)(node[-0xc].right + 10));
            paVar7 = avl_next(node);
            avl_remove(&openfiles,node);
            free(elem);
          }
          __mutex = &cpt_lock;
          node = paVar7;
          if (compactor_terminate_signal.super___atomic_base<unsigned_char>._M_i != '\0')
          goto LAB_0010f4a4;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
      __mutex = &sync_mutex;
      pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
      if (compactor_terminate_signal.super___atomic_base<unsigned_char>._M_i != '\0')
      goto LAB_0010f4a4;
      local_d88 = (list)convert_reltime_to_abstime(15000);
      pthread_cond_timedwait
                ((pthread_cond_t *)&sync_cond,(pthread_mutex_t *)&sync_mutex,(timespec *)&local_d88)
      ;
      aVar2 = compactor_terminate_signal;
      pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
    } while (aVar2.super___atomic_base<unsigned_char>._M_i == '\0');
  }
  else {
LAB_0010f4a4:
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return (void *)0x0;
}

Assistant:

static void *_compactor_thread(void *voidargs)
{
    TEST_INIT();
    int revnum = 0;
    struct compactor_thread_args *args = (struct compactor_thread_args *)
                                         voidargs;
    usleep(2000);
    while(args->num_files) {
        int num_files = args->num_files;
        for (int i = 0; i < num_files; ++i) {
            char filename[256];
            fdb_status status;
            fdb_file_handle *dbfile;
            uint64_t num_markers;
            fdb_snapshot_info_t *markers;
            sprintf(filename, "%s_%d.%d", TEST_FILENAME, i, revnum);
            status = fdb_open(&dbfile, filename, &args->config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
            if (status == FDB_RESULT_NO_DB_INSTANCE) {
                usleep(1000);
                fdb_close(dbfile);
                continue;
            }
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            sprintf(filename, "%s_%d.%d", TEST_FILENAME, i, revnum+1);
            fdb_compact_upto(dbfile, filename,
                             num_markers > 5 ? markers[5].marker
                                             : markers[num_markers].marker);
            fdb_free_snap_markers(markers, num_markers);
            fdb_close(dbfile);
        }
        revnum++;
    }
    thread_exit(0);
    return NULL;
}